

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.h
# Opt level: O0

void Potassco::print(AbstractProgram *out,Id_t termId,TheoryTerm *term)

{
  uint uVar1;
  int iVar2;
  undefined4 in_ESI;
  TheoryTerm *in_RDI;
  TheoryTerm *in_stack_ffffffffffffff88;
  TheoryTerm *in_stack_ffffffffffffff90;
  IdSpan local_40;
  StringSpan local_30;
  Theory_t local_1c [4];
  undefined4 local_c;
  TheoryTerm *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_1c[0] = TheoryTerm::type(in_stack_ffffffffffffff88);
  uVar1 = Theory_t::operator_cast_to_unsigned_int(local_1c);
  if (uVar1 == 0) {
    iVar2 = TheoryTerm::number(in_stack_ffffffffffffff90);
    (**(code **)(local_8->data_ + 0x68))(local_8,local_c,iVar2);
  }
  else if (uVar1 == 1) {
    TheoryTerm::symbol(in_stack_ffffffffffffff90);
    local_30 = toSpan((char *)in_stack_ffffffffffffff90);
    (**(code **)(local_8->data_ + 0x70))(local_8,local_c,&local_30);
  }
  else if (uVar1 == 2) {
    iVar2 = TheoryTerm::compound(local_8);
    local_40 = TheoryTerm::terms(local_8);
    (**(code **)(local_8->data_ + 0x78))(local_8,local_c,iVar2,&local_40);
  }
  return;
}

Assistant:

inline void print(AbstractProgram& out, Id_t termId, const TheoryTerm& term) {
	switch (term.type()) {
		case Potassco::Theory_t::Number  : out.theoryTerm(termId, term.number()); break;
		case Potassco::Theory_t::Symbol  : out.theoryTerm(termId, Potassco::toSpan(term.symbol())); break;
		case Potassco::Theory_t::Compound: out.theoryTerm(termId, term.compound(), term.terms()); break;
	}
}